

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

bool __thiscall Qentem::QExpression::operator>(QExpression *this,uint number)

{
  undefined1 auVar1 [16];
  undefined1 in_ZMM1 [64];
  uint number_local;
  QExpression *this_local;
  
  if (this->Type == NaturalNumber) {
    this_local._7_1_ = (QExpression *)(ulong)number < (this->field_0).SubExpressions.storage_;
  }
  else if (this->Type == IntegerNumber) {
    this_local._7_1_ = (long)(ulong)number < (long)(this->field_0).SubExpressions.storage_;
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,number);
    this_local._7_1_ = auVar1._0_8_ < *(double *)&this->field_0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator>(const Number_T number) const noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                return (Value.Number.Natural > SizeT64(number));
            }

            case ExpressionType::IntegerNumber: {
                return (Value.Number.Integer > SizeT64I(number));
            }

            default: {
                return (Value.Number.Real > double(number));
            }
        }
    }